

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_mapper.h
# Opt level: O0

uint16_t NROM_nametable_address(nes_cartridge *cartridge,uint16_t address)

{
  ushort local_12;
  uint16_t address_local;
  nes_cartridge *cartridge_local;
  
  local_12 = address;
  switch(cartridge->mirroring) {
  case NES_NAMETABLE_MIRRORING_SINGLE_LOW:
    local_12 = address & 0x3ff;
    break;
  case NES_NAMETABLE_MIRRORING_SINGLE_HIGH:
    local_12 = (address & 0x3ff) + 0x800;
    break;
  case NES_NAMETABLE_MIRRORING_VERTICAL:
    local_12 = address & 0x7ff;
    break;
  case NES_NAMETABLE_MIRRORING_HORIZONTAL:
    local_12 = (address / 2 & 0x400) + (address & 0x3ff);
  }
  return local_12;
}

Assistant:

static uint16_t NROM_nametable_address(nes_cartridge* cartridge, uint16_t address)
{
    switch (cartridge->mirroring)
    {
        case NES_NAMETABLE_MIRRORING_VERTICAL:      address = address & 0x7FF; break;
        case NES_NAMETABLE_MIRRORING_HORIZONTAL:    address = ((address / 2) & 0x400) + (address & 0x3FF); break;
        case NES_NAMETABLE_MIRRORING_SINGLE_LOW:    address = address & 0x3FF; break;
        case NES_NAMETABLE_MIRRORING_SINGLE_HIGH:   address = 0x800 + (address & 0x3FF); break;
    }
    return address;
}